

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vsencoding.h
# Opt level: O1

uint32_t * __thiscall
vsencoding::VSEncodingBlocks::decodeVS
          (VSEncodingBlocks *this,uint32_t len,uint32_t *in,uint32_t *out,uint32_t *aux)

{
  undefined1 (*pauVar1) [16];
  undefined1 (*pauVar2) [16];
  uint32_t uVar3;
  undefined8 *puVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  uint *puVar12;
  uint *puVar13;
  int iVar14;
  ulong uVar15;
  uint uVar16;
  uint uVar17;
  uint32_t *pblk [16];
  long alStack_b8 [17];
  
  uVar3 = *in;
  puVar13 = in + (long)(int)uVar3 + 1;
  if (0 < (long)(int)uVar3) {
    puVar12 = in + 1;
    iVar14 = uVar3 + 1;
    do {
      uVar16 = *puVar12;
      uVar17 = uVar16 & 0xf;
      puVar12 = puVar12 + 1;
      uVar16 = uVar16 >> 4;
      uVar15 = (ulong)(uVar17 * 8);
      (**(code **)(__vseblocks_unpack + uVar15))(aux,puVar13,(ulong)uVar16);
      *(uint32_t **)((long)alStack_b8 + uVar15) = aux;
      aux = aux + uVar16;
      puVar13 = puVar13 + (uVar16 * *(int *)(__vseblocks_possLogs + (ulong)uVar17 * 4) + 0x1f >> 5);
      iVar14 = iVar14 + -1;
    } while (1 < iVar14);
  }
  pauVar1 = (undefined1 (*) [16])(out + len);
  do {
    uVar16 = *puVar13;
    uVar17 = uVar16 >> 0x18 & 0xf;
    if (uVar16 < 0x10000000) {
      *(undefined1 (*) [16])out = (undefined1  [16])0x0;
      *(undefined1 (*) [16])((long)out + 0x10) = (undefined1  [16])0x0;
      *(undefined1 (*) [16])((long)out + 0x20) = (undefined1  [16])0x0;
      *(undefined1 (*) [16])((long)out + 0x30) = (undefined1  [16])0x0;
      *(undefined1 (*) [16])((long)out + 0x40) = (undefined1  [16])0x0;
      *(undefined1 (*) [16])((long)out + 0x50) = (undefined1  [16])0x0;
      *(undefined1 (*) [16])((long)out + 0x60) = (undefined1  [16])0x0;
      *(undefined1 (*) [16])((long)out + 0x70) = (undefined1  [16])0x0;
      uVar15 = (ulong)(uint)(&__vseblocks_posszLens)[uVar17];
    }
    else {
      puVar4 = (undefined8 *)alStack_b8[uVar16 >> 0x1c];
      uVar5 = puVar4[1];
      uVar6 = puVar4[2];
      uVar7 = puVar4[3];
      uVar8 = puVar4[4];
      uVar9 = puVar4[5];
      uVar10 = puVar4[6];
      uVar11 = puVar4[7];
      *(undefined8 *)*(undefined1 (*) [16])out = *puVar4;
      *(undefined8 *)(*(undefined1 (*) [16])out + 8) = uVar5;
      *(undefined8 *)*(undefined1 (*) [16])((long)out + 0x10) = uVar6;
      *(undefined8 *)(*(undefined1 (*) [16])((long)out + 0x10) + 8) = uVar7;
      *(undefined8 *)*(undefined1 (*) [16])((long)out + 0x20) = uVar8;
      *(undefined8 *)(*(undefined1 (*) [16])((long)out + 0x20) + 8) = uVar9;
      *(undefined8 *)*(undefined1 (*) [16])((long)out + 0x30) = uVar10;
      *(undefined8 *)(*(undefined1 (*) [16])((long)out + 0x30) + 8) = uVar11;
      uVar15 = (ulong)(uint)(&__vseblocks_possLens)[uVar17];
      alStack_b8[uVar16 >> 0x1c] = alStack_b8[uVar16 >> 0x1c] + uVar15 * 4;
    }
    pauVar2 = (undefined1 (*) [16])(*(undefined1 (*) [16])out + uVar15 * 4);
    uVar17 = *puVar13 >> 0x14 & 0xf;
    uVar16 = *puVar13 >> 0x10 & 0xf;
    if (uVar17 == 0) {
      *pauVar2 = (undefined1  [16])0x0;
      pauVar2[1] = (undefined1  [16])0x0;
      pauVar2[2] = (undefined1  [16])0x0;
      pauVar2[3] = (undefined1  [16])0x0;
      pauVar2[4] = (undefined1  [16])0x0;
      pauVar2[5] = (undefined1  [16])0x0;
      pauVar2[6] = (undefined1  [16])0x0;
      pauVar2[7] = (undefined1  [16])0x0;
      uVar15 = (ulong)(uint)(&__vseblocks_posszLens)[uVar16];
    }
    else {
      puVar4 = (undefined8 *)alStack_b8[uVar17];
      uVar5 = puVar4[1];
      uVar6 = puVar4[2];
      uVar7 = puVar4[3];
      uVar8 = puVar4[4];
      uVar9 = puVar4[5];
      uVar10 = puVar4[6];
      uVar11 = puVar4[7];
      *(undefined8 *)*pauVar2 = *puVar4;
      *(undefined8 *)(*pauVar2 + 8) = uVar5;
      *(undefined8 *)pauVar2[1] = uVar6;
      *(undefined8 *)(pauVar2[1] + 8) = uVar7;
      *(undefined8 *)pauVar2[2] = uVar8;
      *(undefined8 *)(pauVar2[2] + 8) = uVar9;
      *(undefined8 *)pauVar2[3] = uVar10;
      *(undefined8 *)(pauVar2[3] + 8) = uVar11;
      uVar15 = (ulong)(uint)(&__vseblocks_possLens)[uVar16];
      alStack_b8[uVar17] = alStack_b8[uVar17] + uVar15 * 4;
    }
    pauVar2 = (undefined1 (*) [16])(*pauVar2 + uVar15 * 4);
    uVar17 = *puVar13 >> 0xc & 0xf;
    uVar16 = *puVar13 >> 8 & 0xf;
    if (uVar17 == 0) {
      *pauVar2 = (undefined1  [16])0x0;
      pauVar2[1] = (undefined1  [16])0x0;
      pauVar2[2] = (undefined1  [16])0x0;
      pauVar2[3] = (undefined1  [16])0x0;
      pauVar2[4] = (undefined1  [16])0x0;
      pauVar2[5] = (undefined1  [16])0x0;
      pauVar2[6] = (undefined1  [16])0x0;
      pauVar2[7] = (undefined1  [16])0x0;
      uVar15 = (ulong)(uint)(&__vseblocks_posszLens)[uVar16];
    }
    else {
      puVar4 = (undefined8 *)alStack_b8[uVar17];
      uVar5 = puVar4[1];
      uVar6 = puVar4[2];
      uVar7 = puVar4[3];
      uVar8 = puVar4[4];
      uVar9 = puVar4[5];
      uVar10 = puVar4[6];
      uVar11 = puVar4[7];
      *(undefined8 *)*pauVar2 = *puVar4;
      *(undefined8 *)(*pauVar2 + 8) = uVar5;
      *(undefined8 *)pauVar2[1] = uVar6;
      *(undefined8 *)(pauVar2[1] + 8) = uVar7;
      *(undefined8 *)pauVar2[2] = uVar8;
      *(undefined8 *)(pauVar2[2] + 8) = uVar9;
      *(undefined8 *)pauVar2[3] = uVar10;
      *(undefined8 *)(pauVar2[3] + 8) = uVar11;
      uVar15 = (ulong)(uint)(&__vseblocks_possLens)[uVar16];
      alStack_b8[uVar17] = alStack_b8[uVar17] + uVar15 * 4;
    }
    pauVar2 = (undefined1 (*) [16])(*pauVar2 + uVar15 * 4);
    uVar16 = *puVar13 >> 4 & 0xf;
    uVar17 = *puVar13 & 0xf;
    if (uVar16 == 0) {
      *pauVar2 = (undefined1  [16])0x0;
      pauVar2[1] = (undefined1  [16])0x0;
      pauVar2[2] = (undefined1  [16])0x0;
      pauVar2[3] = (undefined1  [16])0x0;
      pauVar2[4] = (undefined1  [16])0x0;
      pauVar2[5] = (undefined1  [16])0x0;
      pauVar2[6] = (undefined1  [16])0x0;
      pauVar2[7] = (undefined1  [16])0x0;
      uVar17 = (&__vseblocks_posszLens)[uVar17];
    }
    else {
      puVar4 = (undefined8 *)alStack_b8[uVar16];
      uVar5 = puVar4[1];
      uVar6 = puVar4[2];
      uVar7 = puVar4[3];
      uVar8 = puVar4[4];
      uVar9 = puVar4[5];
      uVar10 = puVar4[6];
      uVar11 = puVar4[7];
      *(undefined8 *)*pauVar2 = *puVar4;
      *(undefined8 *)(*pauVar2 + 8) = uVar5;
      *(undefined8 *)pauVar2[1] = uVar6;
      *(undefined8 *)(pauVar2[1] + 8) = uVar7;
      *(undefined8 *)pauVar2[2] = uVar8;
      *(undefined8 *)(pauVar2[2] + 8) = uVar9;
      *(undefined8 *)pauVar2[3] = uVar10;
      *(undefined8 *)(pauVar2[3] + 8) = uVar11;
      uVar17 = (&__vseblocks_possLens)[uVar17];
      alStack_b8[uVar16] = alStack_b8[uVar16] + (ulong)uVar17 * 4;
    }
    puVar13 = puVar13 + 1;
    out = (uint32_t *)(*pauVar2 + (ulong)uVar17 * 4);
  } while (out < pauVar1);
  return puVar13;
}

Assistant:

inline const uint32_t *VSEncodingBlocks::decodeVS(uint32_t len,
                       const uint32_t *in, uint32_t *out, uint32_t *aux) {
  int ntotal;
  uint32_t nblk;
  const uint32_t *addr;
  uint32_t *pblk[VSEBLOCKS_LOGS_LEN];
  uint32_t B;
  uint32_t K;
  uint32_t *end;

  //__validate(in, len);

  ntotal = *in++;
  addr = in + ntotal;

  while (ntotal-- > 0) {
    B = (*in) & (VSEBLOCKS_LOGS_LEN - 1);
    nblk = *(in++) >> VSEBLOCKS_LOGLEN;

    /* Do unpacking */
    (__vseblocks_unpack[B])(aux, addr, nblk);

    pblk[B] = aux;
    aux += nblk;
    addr += (nblk * __vseblocks_possLogs[B] + 31) / 32;
  }

  /*
   * FIXME: We assume that a 32-bit block is processed in a loop here.
   * I might think some amount of 32-bit blocks are processed simutaneously.
   */
  end = out + len;

  do {
    /* Permuting integers with a first 8-bit */
    B = (*addr) >> (VSEBLOCKS_LOGDESC * 3 + VSEBLOCKS_LOGLEN);
    K = (((*addr) >> (VSEBLOCKS_LOGDESC * 3)) & (VSEBLOCKS_LENS_LEN - 1));

    if (B) {
      /*
             * NOTICE: If a max value in __vseblocks_possLens[] is
             * over 16, a code below needs to be fixed.
             * __vseblocks_copy16() just copies 16 values each.
             */ __vseblocks_copy16(pblk[B], out);
      pblk[B] += __vseblocks_possLens[K];
      out += __vseblocks_possLens[K];
    } else {
      /* FIXME: Is it better to do memcpy() firstly? */ __vseblocks_zero32(out);
      out += __vseblocks_posszLens[K];
    }

    /* Permuting integers with a second 8-bit */
    B = ((*addr) >> (VSEBLOCKS_LOGDESC * 2 + VSEBLOCKS_LOGLEN)) &
        (VSEBLOCKS_LOGS_LEN - 1);
    K = (((*addr) >> (VSEBLOCKS_LOGDESC * 2)) & (VSEBLOCKS_LENS_LEN - 1));

    if (B) {
      __vseblocks_copy16(pblk[B], out);
      pblk[B] += __vseblocks_possLens[K];
      out += __vseblocks_possLens[K];
    } else {
      __vseblocks_zero32(out);
      out += __vseblocks_posszLens[K];
    }

    /* Permuting integers with a third 8-bit */
    B = ((*addr) >> (VSEBLOCKS_LOGDESC + VSEBLOCKS_LOGLEN)) &
        (VSEBLOCKS_LOGS_LEN - 1);
    K = (((*addr) >> VSEBLOCKS_LOGDESC) & (VSEBLOCKS_LENS_LEN - 1));

    if (B) {
      __vseblocks_copy16(pblk[B], out);
      pblk[B] += __vseblocks_possLens[K];
      out += __vseblocks_possLens[K];
    } else {
      __vseblocks_zero32(out);
      out += __vseblocks_posszLens[K];
    }

    /* Permuting integers with a fourth 8-bit */
    B = ((*addr) >> VSEBLOCKS_LOGLEN) & (VSEBLOCKS_LOGS_LEN - 1);
    K = (*addr++) & (VSEBLOCKS_LENS_LEN - 1);

    if (B) {
      __vseblocks_copy16(pblk[B], out);
      pblk[B] += __vseblocks_possLens[K];
      out += __vseblocks_possLens[K];
    } else {
      __vseblocks_zero32(out);
      out += __vseblocks_posszLens[K];
    }
  } while (end > out);
  return addr;
}